

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O3

bool operator<(BigNumber *b1,BigNumber *b2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  BigNumber local_60;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  pcVar2 = (b1->_numberString)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (b1->_numberString)._M_string_length);
  if (local_38 == (b2->_numberString)._M_string_length) {
    if (local_38 != 0) {
      iVar4 = bcmp(local_40,(b2->_numberString)._M_dataplus._M_p,local_38);
      if (iVar4 != 0) goto LAB_00103e96;
    }
    bVar3 = false;
  }
  else {
LAB_00103e96:
    paVar1 = &local_60._numberString.field_2;
    pcVar2 = (b1->_numberString)._M_dataplus._M_p;
    local_60._numberString._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + (b1->_numberString)._M_string_length);
    bVar3 = operator>(&local_60,b2);
    bVar3 = !bVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._numberString._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._numberString._M_dataplus._M_p,
                      local_60._numberString.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return bVar3;
}

Assistant:

bool operator<(BigNumber b1, const BigNumber &b2) {
    return !(b1 == b2) && !(b1 > b2);
}